

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode wc_statemach(connectdata *conn)

{
  SessionHandle *pSVar1;
  undefined8 *puVar2;
  CURLcode CVar3;
  WildcardData *pWVar4;
  char *pcVar5;
  long lVar6;
  curl_wildcard_states cVar7;
  ftp_wc_tmpdata *ftp_tmp_1;
  long userresponse;
  char *tmp_path;
  curl_fileinfo *finfo;
  ftp_conn *ftpc;
  ftp_wc_tmpdata *ftp_tmp;
  CURLcode result;
  WildcardData *wildcard;
  connectdata *conn_local;
  
  pSVar1 = conn->data;
  pWVar4 = &pSVar1->wildcard;
  ftp_tmp._4_4_ = CURLE_OK;
  switch(pWVar4->state) {
  case CURLWC_INIT:
    ftp_tmp._4_4_ = init_wc_data(conn);
    if (pWVar4->state != CURLWC_CLEAN) {
      cVar7 = CURLWC_MATCHING;
      if (ftp_tmp._4_4_ != CURLE_OK) {
        cVar7 = CURLWC_ERROR;
      }
      pWVar4->state = cVar7;
    }
    break;
  case CURLWC_MATCHING:
    puVar2 = (undefined8 *)(pSVar1->wildcard).tmp;
    (conn->data->set).fwrite_func = (curl_write_callback)puVar2[1];
    (conn->data->set).out = (void *)puVar2[2];
    puVar2[1] = 0;
    puVar2[2] = 0;
    pWVar4->state = CURLWC_DOWNLOADING;
    CVar3 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar2);
    if (CVar3 != CURLE_OK) {
      pWVar4->state = CURLWC_CLEAN;
      CVar3 = wc_statemach(conn);
      return CVar3;
    }
    if (((pSVar1->wildcard).filelist)->size == 0) {
      pWVar4->state = CURLWC_CLEAN;
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    CVar3 = wc_statemach(conn);
    return CVar3;
  case CURLWC_DOWNLOADING:
    puVar2 = (undefined8 *)((pSVar1->wildcard).filelist)->head->ptr;
    pcVar5 = curl_maprintf("%s%s",(pSVar1->wildcard).path,*puVar2);
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (*Curl_cfree)((conn->data->state).pathbuffer);
    (conn->data->state).pathbuffer = (char *)0x0;
    (conn->data->state).pathbuffer = pcVar5;
    (conn->data->state).path = pcVar5;
    Curl_infof(conn->data,"Wildcard - START of \"%s\"\n",*puVar2);
    if ((conn->data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
      lVar6 = (*(conn->data->set).chunk_bgn)
                        (puVar2,(pSVar1->wildcard).customptr,
                         (int)((pSVar1->wildcard).filelist)->size);
      if (lVar6 == 1) {
        return CURLE_CHUNK_FAILED;
      }
      if (lVar6 == 2) {
        Curl_infof(conn->data,"Wildcard - \"%s\" skipped by user\n",*puVar2);
        pWVar4->state = CURLWC_SKIP;
        CVar3 = wc_statemach(conn);
        return CVar3;
      }
    }
    if (*(int *)(puVar2 + 1) != 0) {
      pWVar4->state = CURLWC_SKIP;
      CVar3 = wc_statemach(conn);
      return CVar3;
    }
    if ((*(uint *)(puVar2 + 0xc) & 0x40) != 0) {
      (conn->proto).ftpc.known_filesize = puVar2[5];
    }
    CVar3 = ftp_parse_url_path(conn);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    Curl_llist_remove((pSVar1->wildcard).filelist,((pSVar1->wildcard).filelist)->head,(void *)0x0);
    ftp_tmp._4_4_ = CURLE_OK;
    if (((pSVar1->wildcard).filelist)->size == 0) {
      pWVar4->state = CURLWC_CLEAN;
      return CURLE_OK;
    }
    break;
  case CURLWC_CLEAN:
    puVar2 = (undefined8 *)(pSVar1->wildcard).tmp;
    ftp_tmp._4_4_ = CURLE_OK;
    if (puVar2 != (undefined8 *)0x0) {
      ftp_tmp._4_4_ = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar2);
    }
    cVar7 = CURLWC_DONE;
    if (ftp_tmp._4_4_ != CURLE_OK) {
      cVar7 = CURLWC_ERROR;
    }
    pWVar4->state = cVar7;
    break;
  case CURLWC_SKIP:
    if ((conn->data->set).chunk_end != (curl_chunk_end_callback)0x0) {
      (*(conn->data->set).chunk_end)((conn->data->wildcard).customptr);
    }
    Curl_llist_remove((pSVar1->wildcard).filelist,((pSVar1->wildcard).filelist)->head,(void *)0x0);
    cVar7 = CURLWC_DOWNLOADING;
    if (((pSVar1->wildcard).filelist)->size == 0) {
      cVar7 = CURLWC_CLEAN;
    }
    pWVar4->state = cVar7;
    CVar3 = wc_statemach(conn);
    return CVar3;
  case CURLWC_ERROR:
  case CURLWC_DONE:
  }
  return ftp_tmp._4_4_;
}

Assistant:

static CURLcode wc_statemach(struct connectdata *conn)
{
  struct WildcardData * const wildcard = &(conn->data->wildcard);
  CURLcode result = CURLE_OK;

  switch (wildcard->state) {
  case CURLWC_INIT:
    result = init_wc_data(conn);
    if(wildcard->state == CURLWC_CLEAN)
      /* only listing! */
      break;
    else
      wildcard->state = result ? CURLWC_ERROR : CURLWC_MATCHING;
    break;

  case CURLWC_MATCHING: {
    /* In this state is LIST response successfully parsed, so lets restore
       previous WRITEFUNCTION callback and WRITEDATA pointer */
    struct ftp_wc_tmpdata *ftp_tmp = wildcard->tmp;
    conn->data->set.fwrite_func = ftp_tmp->backup.write_function;
    conn->data->set.out = ftp_tmp->backup.file_descriptor;
    ftp_tmp->backup.write_function = ZERO_NULL;
    ftp_tmp->backup.file_descriptor = NULL;
    wildcard->state = CURLWC_DOWNLOADING;

    if(Curl_ftp_parselist_geterror(ftp_tmp->parser)) {
      /* error found in LIST parsing */
      wildcard->state = CURLWC_CLEAN;
      return wc_statemach(conn);
    }
    else if(wildcard->filelist->size == 0) {
      /* no corresponding file */
      wildcard->state = CURLWC_CLEAN;
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    return wc_statemach(conn);
  }

  case CURLWC_DOWNLOADING: {
    /* filelist has at least one file, lets get first one */
    struct ftp_conn *ftpc = &conn->proto.ftpc;
    struct curl_fileinfo *finfo = wildcard->filelist->head->ptr;

    char *tmp_path = aprintf("%s%s", wildcard->path, finfo->filename);
    if(!tmp_path)
      return CURLE_OUT_OF_MEMORY;

    /* switch default "state.pathbuffer" and tmp_path, good to see
       ftp_parse_url_path function to understand this trick */
    Curl_safefree(conn->data->state.pathbuffer);
    conn->data->state.pathbuffer = tmp_path;
    conn->data->state.path = tmp_path;

    infof(conn->data, "Wildcard - START of \"%s\"\n", finfo->filename);
    if(conn->data->set.chunk_bgn) {
      long userresponse = conn->data->set.chunk_bgn(
          finfo, wildcard->customptr, (int)wildcard->filelist->size);
      switch(userresponse) {
      case CURL_CHUNK_BGN_FUNC_SKIP:
        infof(conn->data, "Wildcard - \"%s\" skipped by user\n",
              finfo->filename);
        wildcard->state = CURLWC_SKIP;
        return wc_statemach(conn);
      case CURL_CHUNK_BGN_FUNC_FAIL:
        return CURLE_CHUNK_FAILED;
      }
    }

    if(finfo->filetype != CURLFILETYPE_FILE) {
      wildcard->state = CURLWC_SKIP;
      return wc_statemach(conn);
    }

    if(finfo->flags & CURLFINFOFLAG_KNOWN_SIZE)
      ftpc->known_filesize = finfo->size;

    result = ftp_parse_url_path(conn);
    if(result)
      return result;

    /* we don't need the Curl_fileinfo of first file anymore */
    Curl_llist_remove(wildcard->filelist, wildcard->filelist->head, NULL);

    if(wildcard->filelist->size == 0) { /* remains only one file to down. */
      wildcard->state = CURLWC_CLEAN;
      /* after that will be ftp_do called once again and no transfer
         will be done because of CURLWC_CLEAN state */
      return CURLE_OK;
    }
  } break;

  case CURLWC_SKIP: {
    if(conn->data->set.chunk_end)
      conn->data->set.chunk_end(conn->data->wildcard.customptr);
    Curl_llist_remove(wildcard->filelist, wildcard->filelist->head, NULL);
    wildcard->state = (wildcard->filelist->size == 0) ?
                      CURLWC_CLEAN : CURLWC_DOWNLOADING;
    return wc_statemach(conn);
  }

  case CURLWC_CLEAN: {
    struct ftp_wc_tmpdata *ftp_tmp = wildcard->tmp;
    result = CURLE_OK;
    if(ftp_tmp)
      result = Curl_ftp_parselist_geterror(ftp_tmp->parser);

    wildcard->state = result ? CURLWC_ERROR : CURLWC_DONE;
  } break;

  case CURLWC_DONE:
  case CURLWC_ERROR:
    break;
  }

  return result;
}